

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O3

void ggml_vec_dot_tq2_0_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [32];
  float fVar2;
  undefined1 auVar3 [16];
  long lVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  fVar14 = 0.0;
  fVar15 = 0.0;
  fVar10 = 0.0;
  fVar13 = 0.0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  fVar19 = 0.0;
  if (0xff < n) {
    auVar20[8] = 3;
    auVar20._0_8_ = 0x303030303030303;
    auVar20[9] = 3;
    auVar20[10] = 3;
    auVar20[0xb] = 3;
    auVar20[0xc] = 3;
    auVar20[0xd] = 3;
    auVar20[0xe] = 3;
    auVar20[0xf] = 3;
    auVar20[0x10] = 3;
    auVar20[0x11] = 3;
    auVar20[0x12] = 3;
    auVar20[0x13] = 3;
    auVar20[0x14] = 3;
    auVar20[0x15] = 3;
    auVar20[0x16] = 3;
    auVar20[0x17] = 3;
    auVar20[0x18] = 3;
    auVar20[0x19] = 3;
    auVar20[0x1a] = 3;
    auVar20[0x1b] = 3;
    auVar20[0x1c] = 3;
    auVar20[0x1d] = 3;
    auVar20[0x1e] = 3;
    auVar20[0x1f] = 3;
    auVar21._8_2_ = 1;
    auVar21._0_8_ = 0x1000100010001;
    auVar21._10_2_ = 1;
    auVar21._12_2_ = 1;
    auVar21._14_2_ = 1;
    auVar21._16_2_ = 1;
    auVar21._18_2_ = 1;
    auVar21._20_2_ = 1;
    auVar21._22_2_ = 1;
    auVar21._24_2_ = 1;
    auVar21._26_2_ = 1;
    auVar21._28_2_ = 1;
    auVar21._30_2_ = 1;
    fVar14 = 0.0;
    fVar10 = 0.0;
    fVar13 = 0.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    uVar6 = 0;
    do {
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      auVar23 = ZEXT1664((undefined1  [16])0x0);
      lVar9 = 0;
      lVar4 = uVar6 * 0x42;
      lVar8 = uVar6 * 0x124;
      bVar5 = true;
      do {
        bVar7 = bVar5;
        auVar1 = *(undefined1 (*) [32])((long)vx + lVar9 + lVar4);
        auVar24 = vpsrlw_avx2(auVar1,2);
        auVar25 = vpsrlw_avx2(auVar1,4);
        auVar26 = vpsrlw_avx2(auVar1,6);
        auVar1 = vpand_avx2(auVar1,auVar20);
        auVar1 = vpmaddubsw_avx2(auVar1,*(undefined1 (*) [32])((long)vy + lVar9 * 4 + lVar8 + 4));
        auVar1 = vpaddw_avx2(auVar1,auVar22._0_32_);
        auVar24 = vpand_avx2(auVar24,auVar20);
        auVar24 = vpmaddubsw_avx2(auVar24,*(undefined1 (*) [32])
                                           ((long)vy + lVar9 * 4 + lVar8 + 0x24));
        auVar1 = vpaddw_avx2(auVar1,auVar24);
        auVar22 = ZEXT3264(auVar1);
        auVar24 = vpand_avx2(auVar25,auVar20);
        auVar24 = vpmaddubsw_avx2(auVar24,*(undefined1 (*) [32])
                                           ((long)vy + lVar9 * 4 + lVar8 + 0x44));
        auVar24 = vpaddw_avx2(auVar24,auVar23._0_32_);
        auVar25 = vpand_avx2(auVar26,auVar20);
        auVar25 = vpmaddubsw_avx2(auVar25,*(undefined1 (*) [32])((long)vy + lVar9 * 4 + lVar8 + 100)
                                 );
        lVar9 = 0x20;
        auVar24 = vpaddw_avx2(auVar24,auVar25);
        auVar23 = ZEXT3264(auVar24);
        bVar5 = false;
      } while (bVar7);
      auVar1 = vpaddw_avx2(auVar1,auVar24);
      auVar1 = vpsubw_avx2(auVar1,*(undefined1 (*) [32])((long)vy + lVar8 + 0x104));
      uVar6 = uVar6 + 1;
      fVar2 = *(float *)((long)vy + lVar8) *
              *(float *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)vx + lVar4 + 0x40) * 4);
      auVar1 = vpmaddwd_avx2(auVar1,auVar21);
      auVar1 = vcvtdq2ps_avx(auVar1);
      fVar10 = fVar10 + fVar2 * auVar1._0_4_;
      fVar13 = fVar13 + fVar2 * auVar1._4_4_;
      fVar14 = fVar14 + fVar2 * auVar1._8_4_;
      fVar15 = fVar15 + fVar2 * auVar1._12_4_;
      fVar16 = fVar16 + fVar2 * auVar1._16_4_;
      fVar17 = fVar17 + fVar2 * auVar1._20_4_;
      fVar18 = fVar18 + fVar2 * auVar1._24_4_;
      fVar19 = fVar19 + auVar1._28_4_;
    } while (uVar6 != (uint)n >> 8);
  }
  auVar11._0_4_ = fVar16 + fVar10;
  auVar11._4_4_ = fVar17 + fVar13;
  auVar11._8_4_ = fVar18 + fVar14;
  auVar11._12_4_ = fVar19 + fVar15;
  auVar3 = vshufpd_avx(auVar11,auVar11,1);
  auVar12._0_4_ = auVar11._0_4_ + auVar3._0_4_;
  auVar12._4_4_ = auVar11._4_4_ + auVar3._4_4_;
  auVar12._8_4_ = auVar11._8_4_ + auVar3._8_4_;
  auVar12._12_4_ = auVar11._12_4_ + auVar3._12_4_;
  auVar3 = vhaddps_avx(auVar12,auVar12);
  *s = auVar3._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_tq2_0_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_tq2_0 * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)
    float sumf = 0.0f;

    const uint8x16_t m3 = vdupq_n_u8(3);

    for (int i = 0; i < nb; ++i) {
#if defined(__ARM_FEATURE_DOTPROD)
        int32x4_t sumi0 = vdupq_n_s32(0);
        int32x4_t sumi1 = vdupq_n_s32(0);
#else
        int16x8_t sumi0 = vdupq_n_s16(0);
        int16x8_t sumi1 = vdupq_n_s16(0);
#endif

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + j);
            uint8x16_t qx1 = vld1q_u8(x[i].qs + j + 16);
            uint8x16_t qx2 = vshrq_n_u8(qx0, 2);
            uint8x16_t qx3 = vshrq_n_u8(qx1, 2);
            uint8x16_t qx4 = vshrq_n_u8(qx0, 4);
            uint8x16_t qx5 = vshrq_n_u8(qx1, 4);
            uint8x16_t qx6 = vshrq_n_u8(qx0, 6);
            uint8x16_t qx7 = vshrq_n_u8(qx1, 6);

            int8x16_t sqx0 = vreinterpretq_s8_u8(vandq_u8(qx0, m3));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vandq_u8(qx1, m3));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vandq_u8(qx2, m3));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vandq_u8(qx3, m3));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vandq_u8(qx4, m3));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vandq_u8(qx5, m3));
            int8x16_t sqx6 = vreinterpretq_s8_u8(vandq_u8(qx6, m3));
            int8x16_t sqx7 = vreinterpretq_s8_u8(vandq_u8(qx7, m3));

            const int8x16_t qy0 = vld1q_s8(y[i].qs + j*4 +   0);
            const int8x16_t qy1 = vld1q_s8(y[i].qs + j*4 +  16);
            const int8x16_t qy2 = vld1q_s8(y[i].qs + j*4 +  32);
            const int8x16_t qy3 = vld1q_s8(y[i].qs + j*4 +  48);
            const int8x16_t qy4 = vld1q_s8(y[i].qs + j*4 +  64);
            const int8x16_t qy5 = vld1q_s8(y[i].qs + j*4 +  80);
            const int8x16_t qy6 = vld1q_s8(y[i].qs + j*4 +  96);
            const int8x16_t qy7 = vld1q_s8(y[i].qs + j*4 + 112);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
            sumi0 = vdotq_s32(sumi0, sqx6, qy6);
            sumi1 = vdotq_s32(sumi1, sqx7, qy7);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx6), vget_low_s8(qy6));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx6), vget_high_s8(qy6));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx7), vget_low_s8(qy7));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx7), vget_high_s8(qy7));
#endif
        }

        const int16x8_t ysum0 = vld1q_s16(y[i].bsums);
        const int16x8_t ysum1 = vld1q_s16(y[i].bsums + 8);

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

#if defined(__ARM_FEATURE_DOTPROD)
        sumi0 = vaddq_s32(sumi0, sumi1);
        sumi0 = vsubq_s32(sumi0, vpaddlq_s16(vaddq_s16(ysum0, ysum1)));

        sumf += d * (float) vaddvq_s32(sumi0);
#else
        sumi0 = vaddq_s16(sumi0, sumi1);
        sumi0 = vsubq_s16(sumi0, vaddq_s16(ysum0, ysum1));

        sumf += d * (float) vaddlvq_s16(sumi0);
#endif
    }

    *s = sumf;

#elif defined(__AVX2__)
    __m256 sumf = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {
        // 16-bit sums, because 256*127 still fits
        __m256i sumi0 = _mm256_setzero_si256();
        __m256i sumi1 = _mm256_setzero_si256();

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            __m256i qx0 = _mm256_loadu_si256((const __m256i *) (x[i].qs + j));
            __m256i qx1 = _mm256_srli_epi16(qx0, 2);
            __m256i qx2 = _mm256_srli_epi16(qx0, 4);
            __m256i qx3 = _mm256_srli_epi16(qx0, 6);

            // 0, 1, 2 (should not be 3)
            qx0 = _mm256_and_si256(qx0, _mm256_set1_epi8(3));
            qx1 = _mm256_and_si256(qx1, _mm256_set1_epi8(3));
            qx2 = _mm256_and_si256(qx2, _mm256_set1_epi8(3));
            qx3 = _mm256_and_si256(qx3, _mm256_set1_epi8(3));

            const __m256i qy0 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 +  0));
            const __m256i qy1 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 32));
            const __m256i qy2 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 64));
            const __m256i qy3 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 96));

            qx0 = _mm256_maddubs_epi16(qx0, qy0);
            qx1 = _mm256_maddubs_epi16(qx1, qy1);
            qx2 = _mm256_maddubs_epi16(qx2, qy2);
            qx3 = _mm256_maddubs_epi16(qx3, qy3);

            sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(qx0, qx1));
            sumi1 = _mm256_add_epi16(sumi1, _mm256_add_epi16(qx2, qx3));
        }

        const __m256i ysum = _mm256_loadu_si256((const __m256i *) y[i].bsums);
        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(x[i].d));

        sumi0 = _mm256_add_epi16(sumi0, sumi1);
        sumi0 = _mm256_sub_epi16(sumi0, ysum);
        sumi0 = _mm256_madd_epi16(sumi0, _mm256_set1_epi16(1));

        sumf = _mm256_add_ps(_mm256_mul_ps(_mm256_cvtepi32_ps(sumi0), d), sumf);
    }

    *s = hsum_float_8(sumf);

#else
    float sumf = 0.0f;

    for (int i = 0; i < nb; ++i) {
        int32_t sumi = 0;

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            for (size_t l = 0; l < 4; ++l) {
                for (size_t k = 0; k < 32; ++k) {
                    sumi += y[i].qs[j*4 + l*32 + k] * (((x[i].qs[j + k] >> (l*2)) & 3) - 1);
                }
            }
        }

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        sumf += (float) sumi * d;
    }

    *s = sumf;
#endif
}